

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void error<String,String,String>(char *fmtstr,String *args,String *args_1,String *args_2)

{
  allocator local_61;
  String local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__cxx11::string::string((string *)local_40,fmtstr,&local_61);
  format<String,String,String>(&local_60,(String *)local_40,args,args_1,args_2);
  error(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._string._M_dataplus._M_p != &local_60._string.field_2) {
    operator_delete(local_60._string._M_dataplus._M_p);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}